

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

Test * __thiscall
testing::internal::TestFactoryImpl<BloatyTest_SimpleBinary_Test>::CreateTest
          (TestFactoryImpl<BloatyTest_SimpleBinary_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x20);
  Test::Test(this_00);
  this_00[1]._vptr_Test = (_func_int **)0x0;
  this_00->_vptr_Test = (_func_int **)&PTR__BloatyTest_0062db20;
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }